

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  value_type_conflict3 *pvVar4;
  value_type_conflict3 local_28 [3];
  value_type_conflict3 local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  Descriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  pDVar2 = containing_type(this);
  if (pDVar2 == (Descriptor *)0x0) {
    local_28[1] = 4;
    pvVar4 = local_28 + 1;
    std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar4);
    pvVar1 = local_18;
    pcVar3 = index(this,(char *)pvVar4,__c_00);
    local_28[0] = (value_type_conflict3)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_28);
  }
  else {
    pDVar2 = containing_type(this);
    GetLocationPath(pDVar2,local_18);
    local_1c = 3;
    pvVar4 = &local_1c;
    std::vector<int,_std::allocator<int>_>::push_back(local_18,pvVar4);
    pvVar1 = local_18;
    pcVar3 = index(this,(char *)pvVar4,__c);
    local_28[2] = (value_type_conflict3)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_28 + 2);
  }
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}